

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::dec_int(spec *s)

{
  initializer_list<unsigned_char> cs;
  character_either *in_RDI;
  anon_class_1_0_00000001 digit19;
  undefined7 in_stack_fffffffffffffe58;
  char_type in_stack_fffffffffffffe5f;
  digit *in_stack_fffffffffffffe60;
  character_either *this;
  character_either *in_stack_fffffffffffffe68;
  maybe *in_stack_fffffffffffffe70;
  sequence *args_1;
  character_either *this_00;
  scanner_base in_stack_fffffffffffffe90;
  sequence local_158 [7];
  undefined1 local_5a;
  undefined1 local_59;
  undefined1 *local_58;
  undefined8 local_50;
  uchar local_48 [55];
  undefined1 local_11;
  
  local_11 = 0;
  local_5a = 0x2d;
  local_59 = 0x2b;
  local_58 = &local_5a;
  local_50 = 2;
  cs._M_len = (size_type)in_stack_fffffffffffffe90._vptr_scanner_base;
  cs._M_array = local_48;
  this_00 = in_RDI;
  character_either::character_either(in_RDI,cs);
  maybe::maybe<toml::detail::character_either>(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  dec_int::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  digit::digit(in_stack_fffffffffffffe60,
               (spec *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  character::character((character *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5f);
  args_1 = local_158;
  digit::digit(in_stack_fffffffffffffe60,
               (spec *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  sequence::sequence<toml::detail::character,toml::detail::syntax::digit>
            ((sequence *)this_00,(character *)in_RDI,(digit *)args_1);
  either::either<toml::detail::syntax::digit,toml::detail::sequence>
            ((either *)this_00,(digit *)in_RDI,args_1);
  repeat_at_least::repeat_at_least<toml::detail::either>
            ((repeat_at_least *)this_00,(size_t)in_RDI,(either *)args_1);
  sequence::sequence<toml::detail::character_in_range,toml::detail::repeat_at_least>
            ((sequence *)this_00,(character_in_range *)in_RDI,(repeat_at_least *)args_1);
  this = (character_either *)&stack0xfffffffffffffe90;
  digit::digit((digit *)this,(spec *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  either::either<toml::detail::sequence,toml::detail::syntax::digit>
            ((either *)this_00,(sequence *)in_RDI,(digit *)args_1);
  sequence::sequence<toml::detail::maybe,toml::detail::either>
            ((sequence *)this_00,(maybe *)in_RDI,(either *)args_1);
  either::~either((either *)this);
  digit::~digit((digit *)this);
  sequence::~sequence((sequence *)this);
  repeat_at_least::~repeat_at_least((repeat_at_least *)this);
  either::~either((either *)this);
  sequence::~sequence((sequence *)this);
  digit::~digit((digit *)this);
  character::~character((character *)0x67708d);
  digit::~digit((digit *)this);
  character_in_range::~character_in_range((character_in_range *)0x6770a7);
  maybe::~maybe((maybe *)this);
  character_either::~character_either(this);
  return (sequence *)this_00;
}

Assistant:

TOML11_INLINE sequence dec_int(const spec& s)
{
    const auto digit19 = []() {
        return character_in_range(char_type('1'), char_type('9'));
    };
    return sequence(
            maybe(character_either{char_type('-'), char_type('+')}),
            either(
                sequence(
                    digit19(),
                    repeat_at_least(1,
                        either(
                            digit(s),
                            sequence(character(char_type('_')), digit(s))
                        )
                    )
                ),
                digit(s)
            )
        );
}